

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_openssl_bio.c
# Opt level: O3

void amqp_openssl_bio_destroy(void)

{
  BIO_meth_free(amqp_bio_method);
  amqp_bio_method = (BIO_METHOD *)0x0;
  return;
}

Assistant:

void amqp_openssl_bio_destroy(void) {
  assert(amqp_ssl_bio_initialized);
#ifdef AMQP_USE_AMQP_BIO
  BIO_meth_free(amqp_bio_method);
  amqp_bio_method = NULL;
#endif
  amqp_ssl_bio_initialized = 0;
}